

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

Float pbrt::I0(Float x)

{
  long lVar1;
  float in_XMM0_Da;
  int i;
  int i4;
  int64_t ifact;
  Float x2i;
  Float val;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  undefined4 local_c;
  undefined4 local_8;
  
  local_8 = 0.0;
  local_c = 1.0;
  local_18 = 1;
  local_1c = 1;
  for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
    if (1 < local_20) {
      local_18 = local_20 * local_18;
    }
    lVar1 = Sqr<long>(local_18);
    local_8 = local_c / (float)(local_1c * lVar1) + local_8;
    local_c = in_XMM0_Da * in_XMM0_Da * local_c;
    local_1c = local_1c << 2;
  }
  return local_8;
}

Assistant:

PBRT_CPU_GPU
inline Float I0(Float x) {
    Float val = 0;
    Float x2i = 1;
    int64_t ifact = 1;
    int i4 = 1;
    // I0(x) \approx Sum_i x^(2i) / (4^i (i!)^2)
    for (int i = 0; i < 10; ++i) {
        if (i > 1)
            ifact *= i;
        val += x2i / (i4 * Sqr(ifact));
        x2i *= x * x;
        i4 *= 4;
    }
    return val;
}